

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testUtils.h
# Opt level: O1

void csrTest(int dim)

{
  Matrix *this;
  Matrix *this_00;
  Matrix *this_01;
  CSR *this_02;
  Matrix *this_03;
  Matrix *this_04;
  CSR *this_05;
  TriangularSolve *this_06;
  Matrix *this_07;
  Matrix *this_08;
  ostream *poVar1;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Matrix *)operator_new(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Lower Triangular","");
  Matrix::Matrix(this,dim,dim,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  Matrix::Random(this);
  Matrix::LowerTriangular(this);
  this_00 = (Matrix *)operator_new(0x30);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"rhs","");
  Matrix::Matrix(this_00,dim,1,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Matrix::Random(this_00);
  this_01 = (Matrix *)operator_new(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Sparse Matrix:","");
  Matrix::Matrix(this_01,dim,dim,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  Matrix::Random(this_01,dim);
  this_02 = (CSR *)operator_new(0x30);
  CSR::CSR(this_02,this_01);
  CSR::triplet(this_02);
  this_03 = CSR::turnToRegular(this_02);
  this_04 = CSR::csrMult(this_02);
  this_05 = (CSR *)operator_new(0x30);
  CSR::CSR(this_05,this);
  this_06 = (TriangularSolve *)operator_new(4);
  TriangularSolve::TriangularSolve(this_06,dim);
  this_07 = TriangularSolve::solve(this_06,this_05,this_00);
  Matrix::print(this_07);
  this_08 = CSR::csrMult(this_05,this_07);
  Matrix::isequal(this_08,this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"the result of Triangular solve is: ",0x23);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  Matrix::~Matrix(this);
  operator_delete(this,0x30);
  Matrix::~Matrix(this_00);
  operator_delete(this_00,0x30);
  Matrix::~Matrix(this_01);
  operator_delete(this_01,0x30);
  CSR::~CSR(this_02);
  operator_delete(this_02,0x30);
  if (this_03 != (Matrix *)0x0) {
    Matrix::~Matrix(this_03);
    operator_delete(this_03,0x30);
  }
  if (this_04 != (Matrix *)0x0) {
    Matrix::~Matrix(this_04);
    operator_delete(this_04,0x30);
  }
  CSR::~CSR(this_05);
  operator_delete(this_05,0x30);
  TriangularSolve::~TriangularSolve(this_06);
  operator_delete(this_06,4);
  Matrix::~Matrix(this_08);
  operator_delete(this_08,0x30);
  Matrix::~Matrix(this_07);
  operator_delete(this_07,0x30);
  return;
}

Assistant:

void  csrTest(int dim)
{
    Matrix *mtxL = new Matrix(dim,dim,"Lower Triangular");
    mtxL->Random();
    mtxL->LowerTriangular();

    Matrix *rhs = new Matrix(dim, 1, "rhs");
    rhs->Random();

    //CSR print & mult
    Matrix *spr = new Matrix(dim,dim, "Sparse Matrix:");
    spr->Random(dim);
    //   spr->print();
    //save matrix in csr format
    CSR *c1 = new CSR(spr);
    c1->triplet();
    Matrix *reg =  c1->turnToRegular();
    //  reg->print();

    Matrix *vector = c1->csrMult();
    // vector->print();

    //csrSolve
    //  mtxL->print();
    //  rhs->print();
    CSR *c2 = new CSR(mtxL);
    TriangularSolve *rs = new TriangularSolve(dim);
    Matrix *result = rs->solve(c2,rhs);
    result->print();

    //csr Solve,Test the equation(c2*y=rhs)
    Matrix *rs3 = c2->csrMult(result);
    //   rs3->print();
    bool r2 = rs3->isequal(rhs);
    cout<<"the result of Triangular solve is: "<<r2 <<"\n";

    delete mtxL;
    delete rhs;
    delete spr;
    delete c1;
    delete reg;
    delete vector;
    delete c2;
    delete rs;
    delete rs3;
    delete result;
}